

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::
basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  size_type *psVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  BasicTypeIterator basicIt;
  int local_2cc;
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  VarType *local_1e8;
  long local_1e0;
  SubTypeIterator<glu::IsBasicType> local_1d8;
  TypeAccessFormat local_1b8;
  undefined1 local_1a8 [8];
  pointer pVStack_1a0;
  pointer local_198;
  pointer pVStack_190;
  ios_base local_138 [264];
  
  if (0 < arraySize) {
    local_250 = &__return_storage_ptr__->field_2;
    lVar5 = *(long *)((long)this + 0x48);
    lVar8 = *(long *)((long)this + 0x50);
    iVar12 = 0;
    iVar3 = 0;
    do {
      local_2cc = iVar3;
      if (0 < (int)((ulong)(lVar8 - lVar5) >> 3) * -0x49249249) {
        lVar13 = 0;
        do {
          local_1e0 = lVar13 * 0x38;
          local_1e8 = (VarType *)(lVar5 + local_1e0 + 0x20);
          glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&local_1d8,local_1e8);
          while( true ) {
            local_198 = (pointer)0x0;
            pVStack_190 = (pointer)0x0;
            local_1a8 = (undefined1  [8])0x0;
            pVStack_1a0 = (pointer)0x0;
            bVar4 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                              (&local_1d8,(SubTypeIterator<glu::IsBasicType> *)local_1a8);
            if (pVStack_1a0 != (pointer)0x0) {
              operator_delete(pVStack_1a0,(long)pVStack_190 - (long)pVStack_1a0);
            }
            if (!bVar4) break;
            if (subobjectIndex == iVar12) goto LAB_01432a66;
            iVar12 = iVar12 + 1;
            glu::SubTypeIterator<glu::IsBasicType>::operator++(&local_1d8);
          }
          if (local_1d8.m_path.
              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d8.m_path.
                            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1d8.m_path.
                                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d8.m_path.
                                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          lVar13 = lVar13 + 1;
          lVar5 = *(long *)((long)this + 0x48);
          lVar8 = *(long *)((long)this + 0x50);
        } while (lVar13 < (int)((ulong)(lVar8 - lVar5) >> 3) * -0x49249249);
      }
      iVar3 = local_2cc + 1;
    } while (local_2cc + 1 != arraySize);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_01432a66:
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,*(long *)((long)this + 0x28),
             *(long *)((long)this + 0x30) + *(long *)((long)this + 0x28));
  std::__cxx11::string::append((char *)&local_290);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,local_2cc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = 0xf;
  if (local_290 != local_280) {
    uVar11 = local_280[0];
  }
  if (uVar11 < (ulong)(local_220 + local_288)) {
    uVar11 = 0xf;
    if (local_228 != local_218) {
      uVar11 = local_218[0];
    }
    if (uVar11 < (ulong)(local_220 + local_288)) goto LAB_01432b55;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_290);
  }
  else {
LAB_01432b55:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_228);
  }
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_2a0 = *plVar7;
    uStack_298 = puVar6[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*puVar6;
  }
  local_2a8 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_1f8 = *plVar9;
    lStack_1f0 = plVar7[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar9;
    local_208 = (long *)*plVar7;
  }
  local_200 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,
                              *(ulong *)(*(long *)((long)this + 0x48) + local_1e0));
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_260 = *puVar10;
    lStack_258 = plVar7[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar10;
    local_270 = (ulong *)*plVar7;
  }
  local_268 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1b8.type = local_1e8;
  local_1b8.path = &local_1d8.m_path;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  glu::operator<<((ostream *)local_1a8,&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = 0xf;
  if (local_270 != &local_260) {
    uVar11 = local_260;
  }
  if (uVar11 < (ulong)(local_240 + local_268)) {
    uVar11 = 0xf;
    if (local_248 != local_238) {
      uVar11 = local_238[0];
    }
    if ((ulong)(local_240 + local_268) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_270);
      goto LAB_01432d61;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_248);
LAB_01432d61:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_250;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar2 = puVar6[3];
    local_250->_M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)local_250 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_1d8.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.m_path.
                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::basicSubobjectAtIndex (int subobjectIndex, int arraySize) const
{
	int currentIndex = 0;
	for (int arrayNdx = 0; arrayNdx < arraySize; arrayNdx++)
	{
		for (int memberNdx = 0; memberNdx < (int)m_members.size(); memberNdx++)
		{
			const glu::VarType& membType = m_members[memberNdx].type;
			for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&membType);
				 basicIt != glu::BasicTypeIterator::end(&membType);
				 ++basicIt)
			{
				if (currentIndex == subobjectIndex)
					return m_interfaceName + "[" + de::toString(arrayNdx) + "]." + m_members[memberNdx].name + de::toString(glu::TypeAccessFormat(membType, basicIt.getPath()));
				currentIndex++;
			}
		}
	}
	DE_ASSERT(false);
	return DE_NULL;
}